

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_MakeFormulaFI2(uint tFun,Dtt_FunImpl_t *pFun,Vec_Vec_t *vLibImpl,int NP,char *sFI1,char *sF
                       ,int fPrint,FILE *pFile)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Dtt_FunImpl_t *pFun_00;
  char local_b8 [8];
  char sFI2 [100];
  Dtt_FunImpl_t *pImpl2;
  int j;
  char *sF_local;
  char *sFI1_local;
  int NP_local;
  Vec_Vec_t *vLibImpl_local;
  Dtt_FunImpl_t *pFun_local;
  uint tFun_local;
  
  memset(local_b8,0,100);
  if (pFun->FI2 == 0) {
    iVar1 = Dtt_ComposeNP(pFun->NP2,NP);
    Dtt_MakePI(iVar1,local_b8);
    Dtt_FunImpl2Str(pFun->Type,sFI1,local_b8,sF);
    if (fPrint != 0) {
      fprintf((FILE *)pFile,"%08x = %s\n",(ulong)tFun,sF);
    }
  }
  else {
    pImpl2._4_4_ = 0;
    while( true ) {
      pVVar2 = Vec_VecEntry(vLibImpl,pFun->FI2);
      iVar1 = Vec_PtrSize(pVVar2);
      if (iVar1 <= pImpl2._4_4_) break;
      pVVar2 = Vec_VecEntry(vLibImpl,pFun->FI2);
      pFun_00 = (Dtt_FunImpl_t *)Vec_PtrEntry(pVVar2,pImpl2._4_4_);
      iVar1 = Dtt_ComposeNP(pFun->NP2,NP);
      Dtt_MakeFormula(tFun,pFun_00,vLibImpl,iVar1,local_b8,0,pFile);
      Dtt_FunImpl2Str(pFun->Type,sFI1,local_b8,sF);
      if (fPrint != 0) {
        fprintf((FILE *)pFile,"%08x = %s\n",(ulong)tFun,sF);
      }
      pImpl2._4_4_ = pImpl2._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void Dtt_MakeFormulaFI2( unsigned tFun, Dtt_FunImpl_t* pFun, Vec_Vec_t* vLibImpl, int NP, char* sFI1, char* sF, int fPrint, FILE* pFile )
{
    int j;
    Dtt_FunImpl_t* pImpl2;
    char sFI2[100] = {0}; //sprintf( sFI2, "" );

    if ( pFun->FI2 == 0 ) // PI
    {
        Dtt_MakePI( Dtt_ComposeNP( pFun->NP2, NP ), sFI2 );
        Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, sF );
        if (fPrint)
            fprintf(pFile, "%08x = %s\n", tFun, sF);
    }
    else
    {
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pImpl2, j, pFun->FI2 )
        {
            Dtt_MakeFormula( tFun, pImpl2, vLibImpl, Dtt_ComposeNP( pFun->NP2, NP ), sFI2, 0, pFile );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, sF );
            if (fPrint)
                fprintf(pFile, "%08x = %s\n", tFun, sF);
        }
    }   
}